

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void PreVisitWith(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  ArenaAllocator *alloc;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *this;
  Scope *innerScope;
  Type *ppFVar1;
  ParseNodeWith *pPVar2;
  FuncInfo *pFVar3;
  
  alloc = byteCodeGenerator->alloc;
  pFVar3 = (FuncInfo *)0x0;
  innerScope = (Scope *)new<Memory::ArenaAllocator>(0x48,alloc,0x366bee);
  innerScope->enclosingScope = (Scope *)0x0;
  innerScope->scopeInfo = (ScopeInfo *)0x0;
  innerScope->location = 0xffffffff;
  innerScope->func = (FuncInfo *)0x0;
  innerScope->m_symList = (Symbol *)0x0;
  innerScope->m_count = 0;
  innerScope->alloc = alloc;
  innerScope->scopeSlotCount = 0;
  innerScope->innerScopeIndex = 0xffffffff;
  innerScope->scopeType = ScopeType_With;
  *(ushort *)&innerScope->field_0x44 =
       (ushort)*(undefined4 *)&innerScope->field_0x44 & 0xf000 | 0x84;
  this = byteCodeGenerator->funcInfoStack;
  if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next != this) {
    ppFVar1 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                        (&this->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    pFVar3 = *ppFVar1;
  }
  innerScope->func = pFVar3;
  innerScope->field_0x44 = innerScope->field_0x44 | 1;
  pPVar2 = ParseNode::AsParseNodeWith(pnode);
  pPVar2->scope = innerScope;
  ByteCodeGenerator::PushScope(byteCodeGenerator,innerScope);
  return;
}

Assistant:

void PreVisitWith(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    ArenaAllocator *alloc = byteCodeGenerator->GetAllocator();
    Scope *scope = Anew(alloc, Scope, alloc, ScopeType_With);
    scope->SetFunc(byteCodeGenerator->TopFuncInfo());
    scope->SetIsDynamic(true);
    pnode->AsParseNodeWith()->scope = scope;

    byteCodeGenerator->PushScope(scope);
}